

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O1

void __thiscall icu_63::RBBITableBuilder::calcFollowPos(RBBITableBuilder *this,RBBINode *n)

{
  void *pvVar1;
  uint uVar2;
  UVector *pUVar3;
  
  if (((n != (RBBINode *)0x0) && (n->fType != leafChar)) && (n->fType != endMark)) {
    calcFollowPos(this,n->fLeftChild);
    calcFollowPos(this,n->fRightChild);
    if ((n->fType == opCat) && (pUVar3 = n->fLeftChild->fLastPosSet, pUVar3->count != 0)) {
      uVar2 = 0;
      do {
        pvVar1 = UVector::elementAt(pUVar3,uVar2);
        setAdd(this,*(UVector **)((long)pvVar1 + 0x98),n->fRightChild->fFirstPosSet);
        uVar2 = uVar2 + 1;
      } while (uVar2 < (uint)pUVar3->count);
    }
    if (((n->fType & ~uset) == opStar) && (pUVar3 = n->fLastPosSet, pUVar3->count != 0)) {
      uVar2 = 0;
      do {
        pvVar1 = UVector::elementAt(pUVar3,uVar2);
        setAdd(this,*(UVector **)((long)pvVar1 + 0x98),n->fFirstPosSet);
        uVar2 = uVar2 + 1;
        pUVar3 = n->fLastPosSet;
      } while (uVar2 < (uint)pUVar3->count);
    }
  }
  return;
}

Assistant:

void RBBITableBuilder::calcFollowPos(RBBINode *n) {
    if (n == NULL ||
        n->fType == RBBINode::leafChar ||
        n->fType == RBBINode::endMark) {
        return;
    }

    calcFollowPos(n->fLeftChild);
    calcFollowPos(n->fRightChild);

    // Aho rule #1
    if (n->fType == RBBINode::opCat) {
        RBBINode *i;   // is 'i' in Aho's description
        uint32_t     ix;

        UVector *LastPosOfLeftChild = n->fLeftChild->fLastPosSet;

        for (ix=0; ix<(uint32_t)LastPosOfLeftChild->size(); ix++) {
            i = (RBBINode *)LastPosOfLeftChild->elementAt(ix);
            setAdd(i->fFollowPos, n->fRightChild->fFirstPosSet);
        }
    }

    // Aho rule #2
    if (n->fType == RBBINode::opStar ||
        n->fType == RBBINode::opPlus) {
        RBBINode   *i;  // again, n and i are the names from Aho's description.
        uint32_t    ix;

        for (ix=0; ix<(uint32_t)n->fLastPosSet->size(); ix++) {
            i = (RBBINode *)n->fLastPosSet->elementAt(ix);
            setAdd(i->fFollowPos, n->fFirstPosSet);
        }
    }



}